

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

Vec_Wrd_t * Zyx_ManTruthTables(Zyx_Man_t *p,word *pTruth)

{
  uint uVar1;
  Vec_Wrd_t *pVVar2;
  Bmc_EsPar_t *pBVar3;
  word *pwVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  pVVar2 = Vec_WrdStart((p->nObjs + 1) * p->nWords);
  p->vInfo = pVVar2;
  pBVar3 = p->pPars;
  iVar5 = pBVar3->nVars;
  uVar6 = 1 << ((byte)iVar5 & 0x1f);
  uVar10 = 0x40;
  if (0x40 < (int)uVar6) {
    uVar10 = uVar6;
  }
  if (pBVar3->fMajority == (uint)(pTruth == (word *)0x0)) {
    for (iVar8 = 0; iVar8 < iVar5; iVar8 = iVar8 + 1) {
      pwVar4 = Zyx_ManTruth(p,iVar8);
      Abc_TtIthVar(pwVar4,iVar8,p->pPars->nVars);
      pBVar3 = p->pPars;
      iVar5 = pBVar3->nVars;
    }
    if (pBVar3->fMajority != 0) {
      for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
        uVar1 = p->pPars->nVars;
        uVar7 = 0;
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = uVar1;
        }
        iVar5 = 0;
        for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          iVar5 = iVar5 + (uint)((uVar6 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if ((int)uVar1 / 2 < iVar5) {
          pwVar4 = Zyx_ManTruth(p,p->nObjs);
          pwVar4[uVar6 >> 6] = pwVar4[uVar6 >> 6] | 1L << ((byte)uVar6 & 0x3f);
        }
      }
      for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
        iVar5 = Abc_TtBitCount16(uVar6);
        iVar8 = p->pPars->nVars / 2;
        if (iVar5 == iVar8 + 1 || iVar5 == iVar8) {
          Vec_IntPush(p->vMidMints,uVar6);
        }
      }
    }
    return pVVar2;
  }
  __assert_fail("p->pPars->fMajority == (pTruth == NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                ,0x2f5,"Vec_Wrd_t *Zyx_ManTruthTables(Zyx_Man_t *, word *)");
}

Assistant:

Vec_Wrd_t * Zyx_ManTruthTables( Zyx_Man_t * p, word * pTruth )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->pPars->nVars );
    assert( p->pPars->fMajority == (pTruth == NULL) );
    for ( i = 0; i < p->pPars->nVars; i++ )
        Abc_TtIthVar( Zyx_ManTruth(p, i), i, p->pPars->nVars );
    if ( p->pPars->fMajority )
    {
        for ( i = 0; i < nMints; i++ )
            if ( Zyx_ManValue(i, p->pPars->nVars) )
                Abc_TtSetBit( Zyx_ManTruth(p, p->nObjs), i );
        for ( i = 0; i < nMints; i++ )
            if ( Abc_TtBitCount16(i) == p->pPars->nVars/2 || Abc_TtBitCount16(i) == p->pPars->nVars/2+1 )
                Vec_IntPush( p->vMidMints, i );
    }
    //Dau_DsdPrintFromTruth( Zyx_ManTruth(p, p->nObjs), p->pPars->nVars );
    return vInfo;
}